

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O1

complex<double> __thiscall
CGL::PathTracer::compute_phase(PathTracer *this,int flare,double u,double v,Vector2D *screen_pos)

{
  pointer pVVar1;
  double __x;
  Vector2D VVar2;
  undefined8 extraout_RAX;
  undefined8 extraout_RDX;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  complex<double> cVar9;
  
  auVar3._0_8_ = (this->sampleBuffer).w;
  auVar3._8_8_ = (this->sampleBuffer).h;
  auVar5 = vpblendd_avx2(auVar3,(undefined1  [16])0x0,10);
  auVar6._8_8_ = 0x4330000000000000;
  auVar6._0_8_ = 0x4330000000000000;
  auVar5 = vpor_avx(auVar5,auVar6);
  auVar3 = vpsrlq_avx(auVar3,0x20);
  auVar7._8_8_ = 0x4530000000000000;
  auVar7._0_8_ = 0x4530000000000000;
  auVar3 = vpor_avx(auVar3,auVar7);
  auVar8._8_8_ = 0x4530000000100000;
  auVar8._0_8_ = 0x4530000000100000;
  auVar3 = vsubpd_avx(auVar3,auVar8);
  auVar4._0_8_ = auVar5._0_8_ + auVar3._0_8_;
  auVar4._8_8_ = auVar5._8_8_ + auVar3._8_8_;
  pVVar1 = (this->flare_origins).super__Vector_base<CGL::Vector2D,_std::allocator<CGL::Vector2D>_>.
           _M_impl.super__Vector_impl_data._M_start + flare;
  auVar5._0_8_ = auVar4._0_8_ * pVVar1->x;
  auVar5._8_8_ = auVar4._8_8_ * pVVar1->y;
  VVar2 = (Vector2D)vroundpd_avx(auVar5,10);
  *screen_pos = VVar2;
  auVar3 = vshufpd_avx(auVar4,auVar4,1);
  auVar5 = vshufpd_avx((undefined1  [16])VVar2,(undefined1  [16])VVar2,1);
  __x = (u * (VVar2.x - auVar4._0_8_ * 0.5) + (auVar3._0_8_ * 0.5 - auVar5._0_8_) * v) *
        6.283185307179586;
  cos(__x);
  sin(__x);
  cVar9._M_value._8_8_ = extraout_RDX;
  cVar9._M_value._0_8_ = extraout_RAX;
  return (complex<double>)cVar9._M_value;
}

Assistant:

std::complex<double> PathTracer::compute_phase(int flare, double u, double v, Vector2D& screen_pos) {
  Vector2D& fo = flare_origins[flare];

  // convert [0, 1] x [0, 1] to [0, width] x [0, height]
  auto lr = (double) (ceil(fo.x * (double)sampleBuffer.w));
  auto ud = (double) (ceil(fo.y * (double)sampleBuffer.h));
  screen_pos = Vector2D(lr, ud);

  // convert [0, width] x [0, height] to [-width / 2, width / 2] x [-height / 2, height / 2]
  // smaller heights are higher up
  lr -= (double)sampleBuffer.w / 2.0;
  ud = -ud + (double)sampleBuffer.h / 2.0;

  return complex_exp(u * lr + v * ud, false);
}